

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O0

unique_ptr<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>_> __thiscall
wabt::MakeUnique<wabt::ExportModuleField,wabt::Location>(wabt *this,Location *args)

{
  ExportModuleField *this_00;
  Location *args_local;
  
  this_00 = (ExportModuleField *)operator_new(0xb0);
  ExportModuleField::ExportModuleField(this_00,args);
  std::unique_ptr<wabt::ExportModuleField,std::default_delete<wabt::ExportModuleField>>::
  unique_ptr<std::default_delete<wabt::ExportModuleField>,void>
            ((unique_ptr<wabt::ExportModuleField,std::default_delete<wabt::ExportModuleField>> *)
             this,this_00);
  return (__uniq_ptr_data<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::ExportModuleField,_std::default_delete<wabt::ExportModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}